

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O1

bool __thiscall
google::protobuf::io::StringOutputStream::Next(StringOutputStream *this,void **data,int *size)

{
  string *psVar1;
  LogMessage *pLVar2;
  ulong uVar3;
  int iVar4;
  LogMessage local_a8;
  LogMessage local_70;
  LogFinisher local_31;
  
  if (this->target_ == (string *)0x0) {
    internal::LogMessage::LogMessage
              (&local_a8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0x8e);
    pLVar2 = internal::LogMessage::operator<<(&local_a8,"CHECK failed: target_ != NULL: ");
    internal::LogFinisher::operator=((LogFinisher *)&local_70,pLVar2);
    internal::LogMessage::~LogMessage(&local_a8);
  }
  psVar1 = this->target_;
  iVar4 = (int)psVar1->_M_string_length;
  uVar3 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(psVar1->_M_dataplus)._M_p != &psVar1->field_2) {
    uVar3 = (psVar1->field_2)._M_allocated_capacity;
  }
  if (uVar3 <= (ulong)(long)iVar4) {
    if (0x3fffffff < iVar4) {
      internal::LogMessage::LogMessage
                (&local_70,LOGLEVEL_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                 ,0x9b);
      pLVar2 = internal::LogMessage::operator<<
                         (&local_70,"Cannot allocate buffer larger than kint32max for ");
      pLVar2 = internal::LogMessage::operator<<(pLVar2,"StringOutputStream.");
      internal::LogFinisher::operator=(&local_31,pLVar2);
      internal::LogMessage::~LogMessage(&local_70);
      return false;
    }
    uVar3 = 0x10;
    if (0x10 < iVar4 * 2) {
      uVar3 = (ulong)(uint)(iVar4 * 2);
    }
  }
  std::__cxx11::string::resize((ulong)psVar1,(char)uVar3);
  *data = (this->target_->_M_dataplus)._M_p + iVar4;
  *size = (int)this->target_->_M_string_length - iVar4;
  return true;
}

Assistant:

bool StringOutputStream::Next(void** data, int* size) {
  GOOGLE_CHECK(target_ != NULL);
  int old_size = target_->size();

  // Grow the string.
  if (old_size < target_->capacity()) {
    // Resize the string to match its capacity, since we can get away
    // without a memory allocation this way.
    STLStringResizeUninitialized(target_, target_->capacity());
  } else {
    // Size has reached capacity, try to double the size.
    if (old_size > std::numeric_limits<int>::max() / 2) {
      // Can not double the size otherwise it is going to cause integer
      // overflow in the expression below: old_size * 2 ";
      GOOGLE_LOG(ERROR) << "Cannot allocate buffer larger than kint32max for "
                 << "StringOutputStream.";
      return false;
    }
    // Double the size, also make sure that the new size is at least
    // kMinimumSize.
    STLStringResizeUninitialized(
        target_,
        std::max(old_size * 2,
                 kMinimumSize + 0));  // "+ 0" works around GCC4 weirdness.
  }

  *data = mutable_string_data(target_) + old_size;
  *size = target_->size() - old_size;
  return true;
}